

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluChangePhase(word *pF,int nVars,int iVar)

{
  word wVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  word *pwVar8;
  int iVar9;
  
  uVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar2 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec16.c"
                  ,0x1ba,"void If_CluChangePhase(word *, int, int)");
  }
  if (iVar < 6) {
    if (0 < (int)uVar2) {
      uVar3 = Truth6[iVar];
      uVar7 = 0;
      do {
        bVar4 = (byte)(1 << ((byte)iVar & 0x1f));
        pF[uVar7] = (pF[uVar7] & uVar3) >> (bVar4 & 0x3f) | (pF[uVar7] & ~uVar3) << (bVar4 & 0x3f);
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
  }
  else if (0 < (int)uVar2) {
    bVar4 = (byte)(iVar + -6);
    uVar6 = 1 << (bVar4 & 0x1f);
    iVar5 = 2 << (bVar4 & 0x1f);
    uVar3 = 1;
    if (1 < (int)uVar6) {
      uVar3 = (ulong)uVar6;
    }
    pwVar8 = pF + (int)uVar6;
    iVar9 = 0;
    do {
      if (iVar + -6 != 0x1f) {
        uVar7 = 0;
        do {
          wVar1 = pF[uVar7];
          pF[uVar7] = pwVar8[uVar7];
          pwVar8[uVar7] = wVar1;
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      iVar9 = iVar9 + iVar5;
      pwVar8 = pwVar8 + iVar5;
      pF = pF + iVar5;
    } while (iVar9 < (int)uVar2);
  }
  return;
}

Assistant:

void If_CluChangePhase( word * pF, int nVars, int iVar )
{
    int nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pF[i] = ((pF[i] & ~Truth6[iVar]) << Shift) | ((pF[i] & Truth6[iVar]) >> Shift);
    }
    else
    {
        word Temp;
        int i, k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                Temp = pF[i];
                pF[i] = pF[Step+i];
                pF[Step+i] = Temp;
            }
            pF += 2*Step;
        }
    }
}